

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serve_static_content.cpp
# Opt level: O3

char * __thiscall (anonymous_namespace)::reader::gets_abi_cxx11_(reader *this,char *__s)

{
  anon_struct_8_0_00000001_for___align aVar1;
  long lVar2;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *this_00;
  char *extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  char *pcVar3;
  ulong in_RDX;
  anon_struct_8_0_00000001_for___align local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_50;
  
  if (in_RDX == 0xffffffffffffffff) {
    pstore::assert_failed
              ("start != std::string::npos",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
               ,99);
  }
  lVar2 = std::__cxx11::string::find(*(char **)__s,0x188d5a,in_RDX);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_70,*(ulong *)__s);
    aVar1 = (anon_struct_8_0_00000001_for___align)((long)&local_50.storage_ + 0x10);
    local_50.valid_ = true;
    if (local_70 == (anon_struct_8_0_00000001_for___align)&local_60) {
      local_50.storage_._24_8_ = uStack_58;
      local_50.storage_.__align = aVar1;
    }
    else {
      local_50.storage_.__align = local_70;
    }
    local_50.storage_._17_7_ = uStack_5f;
    local_50.storage_.__data[0x10] = local_60;
    local_50.storage_._8_8_ = local_68;
    local_68 = 0;
    local_60 = 0;
    this[0x30] = (reader)0x0;
    local_70 = (anon_struct_8_0_00000001_for___align)&local_60;
    this_00 = (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)pstore::
                 error_or<std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>>::
                 value_storage_impl<pstore::error_or<std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>>&,std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>>
                           ((error_or<std::tuple<unsigned_long,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                             *)this);
    pstore::
    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    maybe(this_00,&local_50);
    *(long *)(this_00 + 1) = lVar2 + 2;
    pcVar3 = extraout_RAX;
    if (local_50.valid_ == true) {
      local_50.valid_ = false;
      if (local_50.storage_.__align != aVar1) {
        operator_delete((void *)local_50.storage_.__align,local_50.storage_._16_8_ + 1);
        pcVar3 = extraout_RAX_00;
      }
    }
    if (local_70 != (anon_struct_8_0_00000001_for___align)&local_60) {
      operator_delete((void *)local_70,CONCAT71(uStack_5f,local_60) + 1);
      pcVar3 = extraout_RAX_01;
    }
    return pcVar3;
  }
  pstore::assert_failed
            ("pos != std::string::npos",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
             ,0x65);
}

Assistant:

decltype (auto) gets (state_type const start) {
            using result_type = pstore::error_or_n<state_type, pstore::maybe<std::string>>;

            static auto const crlf = pstore::http::crlf;
            static auto const crlf_len = std::strlen (crlf);

            PSTORE_ASSERT (start != std::string::npos);
            auto const pos = src_.find (crlf, start);
            PSTORE_ASSERT (pos != std::string::npos);
            return result_type{pstore::in_place, pos + crlf_len,
                               pstore::just (src_.substr (start, pos - start))};
        }